

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_finally.cpp
# Opt level: O1

void __thiscall tst_qpromise_finally::rejectedSync_void(tst_qpromise_finally *this)

{
  QSharedData *pQVar1;
  QSharedData *pQVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar3;
  char16_t *this_00;
  PromiseResolver<int> PVar4;
  QArrayData *pQVar5;
  bool bVar6;
  char cVar7;
  PromiseData<int> *this_01;
  PromiseData<void> *pPVar8;
  char *pcVar9;
  char *pcVar10;
  QPromiseReject<void> *in_R8;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_148;
  int value;
  QPromise<void> p;
  PromiseResolver<void> resolver_1;
  QString local_120;
  _Any_data local_108;
  undefined **local_f8;
  PromiseDataBase<void,_void_()> *local_f0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_e8;
  QSharedData *local_e0;
  QString local_d8;
  PromiseResolver<int> resolver;
  QArrayData *local_98;
  PromiseData<int> *pPStack_90;
  _Manager_type local_88;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  value = -1;
  QVar11.m_data = (storage_type *)0x3;
  QVar11.m_size = (qsizetype)&local_108;
  QString::fromUtf8(QVar11);
  local_98 = (QArrayData *)local_108._M_unused._0_8_;
  pPStack_90 = (PromiseData<int> *)local_108._8_8_;
  local_88 = (_Manager_type)local_f8;
  QtPromise::QPromiseBase<void>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:173:24),_0>
            ((QPromiseBase<void> *)&local_d8,(QString *)&local_98);
  this_00 = local_d8.d.ptr;
  local_d8.d.d = (Data *)&PTR__QPromiseBase_0012ca58;
  if ((PromiseDataBase<void,_void_()> *)local_d8.d.ptr != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = &((PromiseDataBase<void,_void_()> *)local_d8.d.ptr)->super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this_01 = (PromiseData<int> *)operator_new(0x68);
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data = (exception_ptr)0x0;
  ((PromiseDataBase<int,_void_(const_int_&)> *)&this_01->m_value)->_vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> **)
   &((QVector<Catcher> *)&(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr
    )->d = (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
  *(qsizetype *)
   &((QVector<Catcher> *)
    &(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size)->d = 0;
  *(qsizetype *)
   &((QVector<Handler> *)
    &(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size)->d = 0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = 0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = 0;
  *(pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> **)
   &((QVector<Handler> *)&(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr
    )->d = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  *(undefined8 *)&((PromiseDataBase<int,_void_(const_int_&)> *)&this_01->m_value)->super_QSharedData
       = 0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_0012cc00;
  QReadWriteLock::QReadWriteLock
            (&(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = 0;
  *(pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> **)
   &((QVector<Handler> *)&(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr
    )->d = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(qsizetype *)
   &((QVector<Handler> *)
    &(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size)->d = 0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = 0;
  *(pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> **)
   &((QVector<Catcher> *)&(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr
    )->d = (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
  *(qsizetype *)
   &((QVector<Catcher> *)
    &(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size)->d = 0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data = (exception_ptr)0x0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseData_0012cb98;
  ((PromiseDataBase<int,_void_(const_int_&)> *)&this_01->m_value)->_vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&((PromiseDataBase<int,_void_(const_int_&)> *)&this_01->m_value)->super_QSharedData
       = 0;
  LOCK();
  pQVar1 = &(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  pQVar1->ref = (QAtomicInt)((int)pQVar1->ref + 1);
  UNLOCK();
  LOCK();
  pQVar1 = &(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  pQVar1->ref = (QAtomicInt)((int)pQVar1->ref + 1);
  UNLOCK();
  local_e0 = &(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  local_108._M_unused._M_object = &PTR__QPromiseBase_0012cb60;
  local_108._8_8_ = this_01;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver,(QPromise<int> *)&local_108);
  local_108._M_unused._M_object = &PTR__QPromiseBase_0012ca28;
  if ((PromiseData<int> *)local_108._8_8_ != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)(local_108._8_8_ + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<int> *)local_108._8_8_ != (PromiseData<int> *)0x0)) {
      (**(code **)(*(long *)local_108._8_8_ + 8))();
    }
  }
  PVar4.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x18);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  local_58._M_unused._0_8_)->d = (Data *)PVar4.m_d.d;
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  ((long)local_58._M_unused._0_8_ + 8))->d = (Data *)PVar4.m_d.d;
  if (PVar4.m_d.d == (Data *)0x0) {
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_58._M_unused._0_8_ + 0x10))->d = (Data *)&value;
    pcStack_40 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
    UNLOCK();
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_58._M_unused._0_8_ + 0x10))->d = (Data *)&value;
    pcStack_40 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
               ::_M_manager;
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
  }
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            ((PromiseDataBase<void,_void_()> *)this_00,(function<void_()> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
    UNLOCK();
  }
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = operator_new(0x18);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  local_78._M_unused._0_8_)->d = (Data *)PVar4.m_d.d;
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  ((long)local_78._M_unused._0_8_ + 8))->d = (Data *)PVar4.m_d.d;
  if (PVar4.m_d.d == (Data *)0x0) {
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_78._M_unused._0_8_ + 0x10))->d = (Data *)&value;
    pcStack_60 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
    UNLOCK();
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_78._M_unused._0_8_ + 0x10))->d = (Data *)&value;
    pcStack_60 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
  }
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            ((PromiseDataBase<void,_void_()> *)this_00,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
  }
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  bVar6 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    ((PromiseDataBase<void,_void_()> *)this_00);
  if (!bVar6) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
              ((PromiseDataBase<void,_void_()> *)this_00);
  }
  LOCK();
  pQVar1 = &((PromiseDataBase<void,_void_()> *)this_00)->super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar1 = &((PromiseDataBase<void,_void_()> *)this_00)->super_QSharedData;
  p.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012caa0;
  pPVar8 = (PromiseData<void> *)operator_new(0x58);
  (pPVar8->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(pPVar8->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar8->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&(pPVar8->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  (pPVar8->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_0012cb38;
  QReadWriteLock::QReadWriteLock(&(pPVar8->super_PromiseDataBase<void,_void_()>).m_lock,0);
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_settled = false;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  (pPVar8->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_0012cac0;
  LOCK();
  pQVar2 = &(pPVar8->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar8 != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar2 = &(pPVar8->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_120.d.d = (Data *)&PTR__QPromiseBase_0012ca58;
  p.super_QPromiseBase<void>.m_d.d = pPVar8;
  local_120.d.ptr = (char16_t *)pPVar8;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_1,(QPromise<void> *)&local_120)
  ;
  local_120.d.d = (Data *)&PTR__QPromiseBase_0012caa0;
  if ((PromiseData<void> *)local_120.d.ptr != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar2 = &((PromiseDataBase<void,_void_()> *)local_120.d.ptr)->super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<void> *)local_120.d.ptr != (PromiseData<void> *)0x0)) {
      (*((PromiseDataBase<void,_void_()> *)local_120.d.ptr)->_vptr_PromiseDataBase[1])();
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  local_148 = resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  local_e8 = resolver_1.m_d.d;
  local_108._M_unused._M_object = (void *)resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  local_108._8_8_ = resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  local_f0 = (PromiseDataBase<void,_void_()> *)this_00;
  LOCK();
  pQVar2 = &((PromiseDataBase<void,_void_()> *)this_00)->super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_f8 = &PTR__QPromiseBase_0012ca58;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       operator_new(0x20);
  *(void **)resolver.m_d.d = local_108._M_unused._M_object;
  if ((Data *)local_108._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_108._M_unused._0_8_ = *local_108._M_unused._M_object + 1;
    UNLOCK();
  }
  ((Data *)resolver.m_d.d)->promise = (QPromise<int> *)local_108._8_8_;
  if ((PromiseData<int> *)local_108._8_8_ != (PromiseData<int> *)0x0) {
    LOCK();
    *(int *)local_108._8_8_ = *(int *)local_108._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)resolver.m_d.d + 0x10) = &PTR__QPromiseBase_0012caa0;
  ((Data *)((long)resolver.m_d.d + 0x10))->promise = (QPromise<int> *)local_f0;
  if (local_f0 != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    (local_f0->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (local_f0->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined ***)((long)resolver.m_d.d + 0x10) = &PTR__QPromiseBase_0012ca58;
  local_f8 = &PTR__QPromiseBase_0012caa0;
  if (local_f0 != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar2 = &local_f0->super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_f0 != (PromiseDataBase<void,_void_()> *)0x0))
    {
      (*local_f0->_vptr_PromiseDataBase[1])();
    }
  }
  if ((PromiseData<int> *)local_108._8_8_ != (PromiseData<int> *)0x0) {
    LOCK();
    *(int *)local_108._8_8_ = *(int *)local_108._8_8_ + -1;
    UNLOCK();
    if ((*(int *)local_108._8_8_ == 0) &&
       ((PromiseData<int> *)local_108._8_8_ != (PromiseData<int> *)0x0)) {
      operator_delete((void *)local_108._8_8_,0x10);
    }
  }
  if ((Data *)local_108._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_108._M_unused._0_8_ = *local_108._M_unused._M_object + -1;
    UNLOCK();
    if ((*local_108._M_unused._M_object == 0) && ((Data *)local_108._M_unused._0_8_ != (Data *)0x0))
    {
      operator_delete(local_108._M_unused._M_object,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            ((PromiseDataBase<int,_void_(const_int_&)> *)this_01,
             (function<void_(const_int_&)> *)&resolver);
  std::
  _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
  ::_M_manager((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
  QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_108,
             (PromiseCatcher<int,decltype(nullptr),void> *)0x0,&local_148,
             (QPromiseResolve<void> *)&local_e8,in_R8);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            ((PromiseDataBase<int,_void_(const_int_&)> *)this_01,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_108);
  if (local_f8 != (undefined **)0x0) {
    (*(code *)local_f8)(&local_108,&local_108,__destroy_functor);
  }
  if (local_e8.d != (Data *)0x0) {
    LOCK();
    ((local_e8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_e8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if (((__int_type)
         ((local_e8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) &&
       (local_e8.d != (Data *)0x0)) {
      operator_delete(local_e8.d,0x10);
    }
  }
  if (local_148.d != (Data *)0x0) {
    LOCK();
    ((local_148.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_148.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((local_148.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       (local_148.d != (Data *)0x0)) {
      operator_delete(local_148.d,0x10);
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver_1.m_d.d == 0) && (resolver_1.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  p.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012ca58;
  bVar6 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    ((PromiseDataBase<int,_void_(const_int_&)> *)this_01);
  if (!bVar6) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              ((PromiseDataBase<int,_void_(const_int_&)> *)this_01);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*((PromiseDataBase<void,_void_()> *)this_00)->_vptr_PromiseDataBase[1])(this_00);
  }
  LOCK();
  (local_e0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_e0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_e0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this_01->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(this_01);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*((PromiseDataBase<void,_void_()> *)this_00)->_vptr_PromiseDataBase[1])(this_00);
  }
  local_d8.d.d = (Data *)&PTR__QPromiseBase_0012caa0;
  if ((PromiseDataBase<void,_void_()> *)local_d8.d.ptr != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = &((PromiseDataBase<void,_void_()> *)local_d8.d.ptr)->super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<void,_void_()> *)local_d8.d.ptr != (PromiseDataBase<void,_void_()> *)0x0))
    {
      (*((PromiseDataBase<void,_void_()> *)local_d8.d.ptr)->_vptr_PromiseDataBase[1])();
    }
  }
  if (local_98 != (QArrayData *)0x0) {
    LOCK();
    (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_98,2,8);
    }
  }
  local_d8.d.d = (Data *)0x0;
  local_d8.d.ptr = (char16_t *)0x0;
  local_d8.d.size = 0;
  waitForError<QString>(&local_120,&p,&local_d8);
  QVar12.m_data = (storage_type *)0x3;
  QVar12.m_size = (qsizetype)&local_98;
  QString::fromUtf8(QVar12);
  pQVar5 = local_98;
  QVar13.m_data = local_120.d.ptr;
  QVar13.m_size = local_120.d.size;
  QVar14.m_data = (storage_type_conflict *)pPStack_90;
  QVar14.m_size = (qsizetype)local_88;
  cVar7 = QTest::qCompare(QVar13,QVar14,"waitForError(p, QString{})","QString{\"foo\"}",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_finally.cpp"
                          ,0x8f);
  if (pQVar5 != (QArrayData *)0x0) {
    LOCK();
    (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar5,2,8);
    }
  }
  if (&(local_120.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_120.d.d)->super_QArrayData,2,8);
    }
  }
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,8);
    }
  }
  QVar3.d = p.super_QPromiseBase<void>.m_d.d;
  if (cVar7 != '\0') {
    bVar6 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                      (&(p.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
    bVar6 = (bool)(~bVar6 & ((QVar3.d)->super_PromiseDataBase<void,_void_()>).m_error.m_data.
                            _M_exception_object != (void *)0x0);
    local_98 = (QArrayData *)CONCAT71(local_98._1_7_,bVar6);
    local_120.d.d = (Data *)CONCAT71(local_120.d.d._1_7_,1);
    pcVar9 = QTest::toString<bool>((bool *)&local_98);
    pcVar10 = QTest::toString<bool>((bool *)&local_120);
    cVar7 = QTest::compare_helper
                      (bVar6,"Compared values are not the same",pcVar9,pcVar10,"p.isRejected()",
                       "true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_finally.cpp"
                       ,0x90);
    if (cVar7 != '\0') {
      QTest::qCompare(value,8,"value","8",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_finally.cpp"
                      ,0x91);
    }
  }
  p.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012caa0;
  if (p.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((p.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((p.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_qpromise_finally::rejectedSync_void()
{
    int value = -1;
    auto p = QtPromise::QPromise<void>::reject(QString{"foo"}).finally([&]() {
        value = 8;
        return 16; // ignored!
    });

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<void>>::value));
    QCOMPARE(waitForError(p, QString{}), QString{"foo"});
    QCOMPARE(p.isRejected(), true);
    QCOMPARE(value, 8);
}